

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dmabuf_test.c
# Opt level: O3

int main(void)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 *puVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  MppBuffer buf;
  MppBufferGroup grp;
  long local_30;
  long local_28;
  
  local_28 = 0;
  local_30 = 0;
  _mpp_log_l(4,"mpp_dmabuf_test","mpp dmabuf test start\n",0);
  iVar1 = mpp_buffer_group_get(&local_28,0x20004,0,"mpp_dmabuf_test","main");
  if (iVar1 == 0) {
    iVar1 = mpp_buffer_get_with_tag(local_28,&local_30,0x100000,"mpp_dmabuf_test","main");
    if (iVar1 == 0) {
      uVar2 = mpp_buffer_get_fd_with_caller(local_30,"main");
      puVar3 = (undefined4 *)mpp_buffer_get_ptr_with_caller(local_30,"main");
      iVar1 = mpp_dmabuf_sync_begin(uVar2,0,"mpp_dmabuf_test");
      if (iVar1 == 0) {
        *puVar3 = 0x64636261;
        _mpp_log_l(4,"mpp_dmabuf_test","ioctl begin cpu access         success\n",0);
        iVar1 = mpp_dmabuf_sync_end(uVar2,0,"mpp_dmabuf_test");
        if (iVar1 == 0) {
          _mpp_log_l(4,"mpp_dmabuf_test","ioctl end cpu access           success\n",0);
          iVar1 = mpp_dmabuf_sync_partial_begin(uVar2,0,0,0x80000,"mpp_dmabuf_test");
          pcVar4 = "success";
          pcVar6 = "failed";
          pcVar5 = "failed";
          if (iVar1 == 0) {
            pcVar5 = "success";
          }
          _mpp_log_l(4,"mpp_dmabuf_test","ioctl begin cpu access partial %s\n",0,pcVar5);
          iVar1 = mpp_dmabuf_sync_partial_end(uVar2,0,0,0x80000,"mpp_dmabuf_test");
          pcVar5 = "failed";
          if (iVar1 == 0) {
            pcVar5 = "success";
          }
          _mpp_log_l(4,"mpp_dmabuf_test","ioctl end cpu access partial   %s\n",0,pcVar5);
          iVar1 = mpp_dmabuf_set_name(uVar2,"dmabuf_test","mpp_dmabuf_test");
          if (iVar1 == 0) {
            pcVar6 = "success";
          }
          _mpp_log_l(4,"mpp_dmabuf_test","ioctl set name                 %s\n",0,pcVar6);
          iVar1 = mpp_dmabuf_sync_partial_support();
          pcVar5 = "YES";
          if (iVar1 == 0) {
            pcVar5 = "NO";
          }
          _mpp_log_l(4,"mpp_dmabuf_test","ioctl sync partial             %s\n",0,pcVar5);
          goto LAB_00101336;
        }
      }
      pcVar4 = "get dmaheap buffer sync begin failed ret %d\n";
    }
    else {
      pcVar4 = "get 1M dmaheap buffer failed ret %d\n";
    }
  }
  else {
    pcVar4 = "get dmaheap buffer group failed ret %d\n";
  }
  _mpp_log_l(2,"mpp_dmabuf_test",pcVar4,0,iVar1);
  pcVar4 = "failed";
LAB_00101336:
  if (local_30 != 0) {
    mpp_buffer_put_with_caller(local_30,"main");
    local_30 = 0;
  }
  if (local_28 != 0) {
    mpp_buffer_group_put();
    local_28 = 0;
  }
  _mpp_log_l(4,"mpp_dmabuf_test","mpp dmabuf test done %s\n",0,pcVar4);
  return 0;
}

Assistant:

int main()
{
    MppBufferGroup grp = NULL;
    MppBuffer buf = NULL;
    RK_S32 fd = -1;
    RK_U8 *ptr = NULL;
    MPP_RET ret = MPP_NOK;

    mpp_logi("mpp dmabuf test start\n");

    do {
        ret = mpp_buffer_group_get_internal(&grp, MPP_BUFFER_TYPE_DMA_HEAP | MPP_BUFFER_FLAGS_CACHABLE);
        if (ret) {
            mpp_loge("get dmaheap buffer group failed ret %d\n", ret);
            break;
        }

        ret = mpp_buffer_get(grp, &buf, SZ_1M);
        if (ret) {
            mpp_loge("get 1M dmaheap buffer failed ret %d\n", ret);
            break;
        }

        fd = mpp_buffer_get_fd(buf);
        ptr = mpp_buffer_get_ptr(buf);

        ret = mpp_dmabuf_sync_begin(fd, 0, MODULE_TAG);
        if (ret) {
            mpp_loge("get dmaheap buffer sync begin failed ret %d\n", ret);
            break;
        }

        ptr[0] = 'a';
        ptr[1] = 'b';
        ptr[2] = 'c';
        ptr[3] = 'd';

        mpp_logi("ioctl begin cpu access         success\n");

        ret = mpp_dmabuf_sync_end(fd, 0, MODULE_TAG);
        if (ret) {
            mpp_loge("get dmaheap buffer sync begin failed ret %d\n", ret);
            break;
        }

        mpp_logi("ioctl end cpu access           success\n");

        ret = mpp_dmabuf_sync_partial_begin(fd, 0, 0, SZ_512K, MODULE_TAG);
        mpp_logi("ioctl begin cpu access partial %s\n", ret ? "failed" : "success");

        ret = mpp_dmabuf_sync_partial_end(fd, 0, 0, SZ_512K, MODULE_TAG);
        mpp_logi("ioctl end cpu access partial   %s\n", ret ? "failed" : "success");

        ret = mpp_dmabuf_set_name(fd, "dmabuf_test", MODULE_TAG);
        mpp_logi("ioctl set name                 %s\n", ret ? "failed" : "success");

        ret = mpp_dmabuf_sync_partial_support();
        mpp_logi("ioctl sync partial             %s\n", ret ? "YES" : "NO");

        ret = MPP_OK;
    } while (0);

    if (buf) {
        mpp_buffer_put(buf);
        buf = NULL;
    }

    if (grp) {
        mpp_buffer_group_put(grp);
        grp = NULL;
    }

    mpp_logi("mpp dmabuf test done %s\n", ret ? "failed" : "success");

    return 0;
}